

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

void virtio_legacy_set_promiscuous(virtio_device *dev,_Bool on)

{
  undefined8 *puVar1;
  uint uVar2;
  uint *puVar3;
  ushort uVar4;
  pkt_buf *ppVar5;
  ssize_t sVar6;
  long lVar7;
  short sVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ushort uVar12;
  uint *puVar13;
  undefined2 local_52;
  ulong local_50;
  ulong local_48;
  pkt_buf *local_40;
  ulong local_38;
  
  puVar3 = (uint *)dev->ctrl_queue;
  uVar2 = *puVar3;
  if (uVar2 == 0) {
LAB_001047f2:
    virtio_legacy_set_promiscuous_cold_5();
LAB_001047f7:
    virtio_legacy_set_promiscuous_cold_4();
LAB_001047fc:
    virtio_legacy_set_promiscuous_cold_1();
  }
  else {
    uVar11 = 0;
    uVar12 = 0;
    if (**(long **)(puVar3 + 2) != 0) {
      uVar4 = 1;
      do {
        uVar12 = uVar4;
        uVar11 = (uint)uVar12;
        if (uVar2 <= uVar11) break;
        uVar4 = uVar12 + 1;
      } while ((*(long **)(puVar3 + 2))[(ulong)uVar12 * 2] != 0);
      if (uVar2 == uVar11) goto LAB_001047f2;
    }
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Found free desc slot at %u (%u)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0x7c,"virtio_legacy_send_command",(ulong)uVar11,(ulong)uVar2);
    ppVar5 = pkt_buf_alloc(*(mempool **)(puVar3 + 0xc));
    if (ppVar5 == (pkt_buf *)0x0) goto LAB_001047f7;
    *(uint *)&ppVar5[1].buf_addr_phy = (uint)on << 0x10;
    local_38 = (ulong)uVar12;
    *(pkt_buf **)(puVar3 + local_38 * 2 + 0xe) = ppVar5;
    lVar7 = *(long *)(puVar3 + 2);
    lVar9 = (ulong)uVar12 * 0x10;
    *(undefined4 *)(lVar7 + 8 + lVar9) = 2;
    *(uintptr_t *)(lVar7 + lVar9) = ppVar5->buf_addr_phy + 0x40;
    *(undefined2 *)(lVar7 + 0xc + lVar9) = 1;
    uVar2 = uVar11 + 1;
    local_48 = (ulong)uVar2;
    *(short *)(lVar7 + 0xe + lVar9) = (short)uVar2;
    uVar10 = (ulong)(uVar2 * 0x10);
    *(undefined4 *)(lVar7 + 8 + uVar10) = 1;
    *(uintptr_t *)(lVar7 + uVar10) = ppVar5->buf_addr_phy + 0x42;
    *(undefined2 *)(lVar7 + 0xc + uVar10) = 1;
    uVar2 = uVar11 + 2;
    local_50 = (ulong)uVar2;
    *(short *)(lVar7 + 0xe + uVar10) = (short)uVar2;
    uVar10 = (ulong)(uVar2 * 0x10);
    *(undefined4 *)(lVar7 + 8 + uVar10) = 1;
    *(uintptr_t *)(lVar7 + uVar10) = ppVar5->buf_addr_phy + 0x43;
    *(undefined4 *)(lVar7 + 0xc + uVar10) = 2;
    *(ushort *)
     (*(long *)(puVar3 + 4) + 4 +
     ((ulong)*(ushort *)(*(long *)(puVar3 + 4) + 2) % (ulong)*puVar3) * 2) = uVar12;
    *(short *)(*(long *)(puVar3 + 4) + 2) = *(short *)(*(long *)(puVar3 + 4) + 2) + 1;
    local_52 = 2;
    local_40 = ppVar5;
    sVar6 = pwrite(dev->fd,&local_52,2,0x10);
    if (sVar6 != 2) goto LAB_001047fc;
    sVar8 = (short)puVar3[10];
    lVar7 = *(long *)(puVar3 + 6);
    if (sVar8 == *(short *)(lVar7 + 2)) {
      do {
        fprintf(_stderr,"[DEBUG] %s:%d %s(): Waiting...\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
                ,0xaa,"virtio_legacy_send_command");
        usleep(100000);
        sVar8 = (short)puVar3[10];
        lVar7 = *(long *)(puVar3 + 6);
      } while (sVar8 == *(short *)(lVar7 + 2));
    }
    *(short *)(puVar3 + 10) = sVar8 + 1;
    lVar7 = lVar7 + (ulong)*(ushort *)(lVar7 + 2) * 8;
    puVar13 = (uint *)(lVar7 + 4);
    fprintf(_stderr,"[DEBUG] %s:%d %s(): e %p: id %u len %u\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
            ,0xb0,"virtio_legacy_send_command",puVar13,(ulong)*puVar13,(ulong)*(uint *)(lVar7 + 8));
    uVar10 = local_38;
    if (*puVar13 == uVar11) {
      if (*(pkt_buf **)(puVar3 + local_38 * 2 + 0xe) == local_40) {
        pkt_buf_free(local_40);
        lVar7 = *(long *)(puVar3 + 2);
        puVar1 = (undefined8 *)(lVar7 + (ulong)(uint)((int)uVar10 << 4));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)(lVar7 + (ulong)(uint)((int)local_48 << 4));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)(lVar7 + (ulong)(uint)((int)local_50 << 4));
        *puVar1 = 0;
        puVar1[1] = 0;
        fprintf(_stdout,"[INFO ] %s:%d %s(): Set promisc to %u\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/virtio.c"
                ,0xca,"virtio_legacy_set_promiscuous",(ulong)on);
        return;
      }
      goto LAB_00104806;
    }
  }
  virtio_legacy_set_promiscuous_cold_2();
LAB_00104806:
  virtio_legacy_set_promiscuous_cold_3();
  return;
}

Assistant:

static void virtio_legacy_send_command(struct virtio_device* dev, void* cmd, size_t cmd_len) {
	struct virtqueue* vq = dev->ctrl_queue;

	if (cmd_len < sizeof(struct virtio_net_ctrl_hdr)) {
		error("Command can not be shorter than control header");
	}
	if (((uint8_t*)cmd)[0] != VIRTIO_NET_CTRL_RX) {
		error("Command class is not supported");
	}

	_mm_mfence();
	// Find free desciptor slot
	uint16_t idx = 0;
	for (idx = 0; idx < vq->vring.num; ++idx) {
		struct vring_desc* desc = &vq->vring.desc[idx];
		if (desc->addr == 0) {
			break;
		}
	}
	if (idx == vq->vring.num) {
		error("command queue full");
	} else {
		debug("Found free desc slot at %u (%u)", idx, vq->vring.num);
	}

	struct pkt_buf* buf = pkt_buf_alloc(vq->mempool);
	if (!buf) {
		error("Control queue ran out of buffers");
	}
	memcpy(buf->data, cmd, cmd_len);
	vq->virtual_addresses[idx] = buf;

	/* The following descriptor setup kills QEMU, but should be allowed with VIRTIO_F_ANY_LAYOUT
	 * Error: kvm: virtio-net ctrl missing headers
	 * Version: QEMU emulator version 2.7.1 pve-qemu-kvm_2.7.1-4
	 */
	// All in one descriptor
	// vq->vring.desc[idx].len = cmd_len;
	// vq->vring.desc[idx].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
	// vq->vring.desc[idx].flags = VRING_DESC_F_WRITE;
	// vq->vring.desc[idx].next = 0;

	// Device-readable head: cmd header
	vq->vring.desc[idx].len = 2;
	vq->vring.desc[idx].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data);
	vq->vring.desc[idx].flags = VRING_DESC_F_NEXT;
	vq->vring.desc[idx].next = idx + 1;
	// Device-readable payload: data
	vq->vring.desc[idx + 1].len = cmd_len - 2 - 1; // Header and ack byte
	vq->vring.desc[idx + 1].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data) + 2;
	vq->vring.desc[idx + 1].flags = VRING_DESC_F_NEXT;
	vq->vring.desc[idx + 1].next = idx + 2;
	// Device-writable tail: ack flag
	vq->vring.desc[idx + 2].len = 1;
	vq->vring.desc[idx + 2].addr = buf->buf_addr_phy + offsetof(struct pkt_buf, data) + cmd_len - 1;
	vq->vring.desc[idx + 2].flags = VRING_DESC_F_WRITE;
	vq->vring.desc[idx + 2].next = 0;
	vq->vring.avail->ring[vq->vring.avail->idx % vq->vring.num] = idx;
	_mm_mfence();
	vq->vring.avail->idx++;
	_mm_mfence();

	virtio_legacy_notify_queue(dev, 2);
	_mm_mfence();

	// Wait until the buffer got processed
	while (vq->vq_used_last_idx == vq->vring.used->idx) {
		_mm_mfence();
		debug("Waiting...");
		usleep(100000);
	}
	vq->vq_used_last_idx++;
	// Check status and free buffer
	struct vring_used_elem* e = &vq->vring.used->ring[vq->vring.used->idx];
	debug("e %p: id %u len %u", e, e->id, e->len);
	if (e->id != idx) {
		error("Used buffer has different index as sent one");
	}
	if (vq->virtual_addresses[idx] != buf) {
		error("buffer differ");
	}
	pkt_buf_free(buf);
	vq->vring.desc[idx] = (struct vring_desc){};
	vq->vring.desc[idx + 1] = (struct vring_desc){};
	vq->vring.desc[idx + 2] = (struct vring_desc){};
}